

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O2

void __thiscall SkylineBinPack::Init(SkylineBinPack *this,int width,int height,bool useWasteMap_)

{
  SkylineNode node;
  SkylineNode local_2c;
  
  this->binWidth = width;
  this->binHeight = height;
  this->useWasteMap = useWasteMap_;
  TArray<Rect,_Rect>::Clear(&(this->disjointRects).rects);
  this->usedSurfaceArea = 0;
  TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::Clear(&this->skyLine);
  local_2c.x = 0;
  local_2c.y = 0;
  local_2c.width = this->binWidth;
  TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::Push(&this->skyLine,&local_2c);
  if (this->useWasteMap == true) {
    GuillotineBinPack::Init(&this->wasteMap,width,height);
    TArray<Rect,_Rect>::Clear(&(this->wasteMap).freeRectangles);
  }
  return;
}

Assistant:

void SkylineBinPack::Init(int width, int height, bool useWasteMap_)
{
	binWidth = width;
	binHeight = height;

	useWasteMap = useWasteMap_;

#ifdef _DEBUG
	disjointRects.Clear();
#endif

	usedSurfaceArea = 0;
	skyLine.Clear();
	SkylineNode node;
	node.x = 0;
	node.y = 0;
	node.width = binWidth;
	skyLine.Push(node);

	if (useWasteMap)
	{
		wasteMap.Init(width, height);
		wasteMap.GetFreeRectangles().Clear();
	}
}